

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_entropymode.c
# Opt level: O3

void AV1SetDefaultCDFs(AV1CDFs *cdfs,MvCDFs *cdfs_ndvc)

{
  RK_U16 (*paRVar1) [7];
  RK_U16 (*paaRVar2) [3] [2];
  RK_U16 (*paRVar3) [6];
  MvCDFs *pMVar4;
  RK_U16 (*paRVar5) [10];
  RK_U16 (*paRVar6) [3];
  
  memcpy(cdfs,default_partition_cdf,0x1a0);
  memcpy(cdfs->tx_type_intra0_cdf,default_intra_ext_tx0_cdf,0x340);
  memcpy(cdfs->tx_type_intra1_cdf,default_intra_ext_tx1_cdf,0x1a0);
  memcpy(cdfs->tx_type_inter_cdf,default_inter_ext_tx_cdf,0x100);
  cdfs->vartx_part_cdf[0] = 0x105b;
  cdfs->vartx_part_cdf[1] = 0x22da;
  cdfs->vartx_part_cdf[2] = 0x2e91;
  cdfs->vartx_part_cdf[3] = 0x2105;
  cdfs->vartx_part_cdf[4] = 0x38ec;
  cdfs->vartx_part_cdf[5] = 0x509b;
  cdfs->vartx_part_cdf[6] = 0x3699;
  cdfs->vartx_part_cdf[7] = 0x5579;
  cdfs->vartx_part_cdf[8] = 0x5503;
  cdfs->vartx_part_cdf[9] = 0x15d5;
  cdfs->vartx_part_cdf[10] = 0x31dc;
  cdfs->vartx_part_cdf[0xb] = 0x53ef;
  cdfs->vartx_part_cdf[0xc] = 0x184b;
  cdfs->vartx_part_cdf[0xd] = 0x3494;
  cdfs->vartx_part_cdf[0xe] = 0x4870;
  cdfs->vartx_part_cdf[0xf] = 0x1291;
  cdfs->vartx_part_cdf[0xe] = 0x4870;
  cdfs->vartx_part_cdf[0xf] = 0x1291;
  cdfs->vartx_part_cdf[0x10] = 0x2bd6;
  cdfs->vartx_part_cdf[0x11] = 0x47c0;
  cdfs->vartx_part_cdf[0x12] = 0x11fb;
  cdfs->vartx_part_cdf[0x13] = 0x287f;
  cdfs->vartx_part_cdf[0x14] = 0x4128;
  cdfs->vartx_part_cdf[0x15] = 0;
  cdfs->mbskip_cdf[0] = 0x449;
  cdfs->mbskip_cdf[1] = 0x3f7d;
  cdfs->mbskip_cdf[2] = 0x6e20;
  cdfs->delta_q_cdf[0] = 0x1200;
  cdfs->delta_q_cdf[1] = 0x288;
  cdfs->delta_q_cdf[2] = 0x5b;
  *(undefined8 *)(cdfs->delta_lf_multi_cdf[2] + 2) = 0x5b02881200005b;
  *(aom_cdf_prob *)((long)(cdfs->delta_lf_multi_cdf + 0) + 0) = 0x1200;
  *(aom_cdf_prob *)((long)(cdfs->delta_lf_multi_cdf + 0) + 2) = 0x288;
  *(aom_cdf_prob *)((long)(cdfs->delta_lf_multi_cdf + 0) + 4) = 0x5b;
  *(aom_cdf_prob *)((long)(cdfs->delta_lf_multi_cdf + 1) + 0) = 0x1200;
  *(undefined8 *)(cdfs->delta_lf_multi_cdf[1] + 1) = 0x2881200005b0288;
  cdfs->delta_lf_cdf[0] = 0x1200;
  cdfs->delta_lf_cdf[1] = 0x288;
  cdfs->delta_lf_cdf[2] = 0x5b;
  cdfs->segment_pred_cdf[0] = 0x4000;
  cdfs->segment_pred_cdf[1] = 0x4000;
  cdfs->segment_pred_cdf[2] = 0x4000;
  *(undefined8 *)(cdfs->spatial_pred_seg_tree_cdf[1] + 6) = 0xfcd10b9147901a8;
  paRVar1 = cdfs->spatial_pred_seg_tree_cdf;
  *(aom_cdf_prob *)((long)(paRVar1 + 2) + 6) = 0xf26;
  *(aom_cdf_prob *)((long)(paRVar1 + 2) + 8) = 0x173;
  *(aom_cdf_prob *)((long)(paRVar1 + 2) + 10) = 0x79;
  *(aom_cdf_prob *)((long)(paRVar1 + 2) + 0xc) = 0x59;
  paRVar1 = cdfs->spatial_pred_seg_tree_cdf;
  *(aom_cdf_prob *)((long)(paRVar1 + 1) + 2) = 0x38ca;
  *(aom_cdf_prob *)((long)(paRVar1 + 1) + 4) = 0x27e3;
  *(aom_cdf_prob *)((long)(paRVar1 + 1) + 6) = 0x1e99;
  *(aom_cdf_prob *)((long)(paRVar1 + 1) + 8) = 0xae4;
  *(undefined8 *)(cdfs->spatial_pred_seg_tree_cdf[1] + 5) = 0x10b9147901a8077d;
  *(aom_cdf_prob *)((long)(cdfs->spatial_pred_seg_tree_cdf + 0) + 0) = 0x6a0a;
  *(aom_cdf_prob *)((long)(cdfs->spatial_pred_seg_tree_cdf + 0) + 2) = 0x612b;
  *(aom_cdf_prob *)((long)(cdfs->spatial_pred_seg_tree_cdf + 0) + 4) = 0x4123;
  *(aom_cdf_prob *)((long)(cdfs->spatial_pred_seg_tree_cdf + 0) + 6) = 0x38c7;
  *(undefined8 *)(cdfs->spatial_pred_seg_tree_cdf[0] + 4) = 0x483e00eb112b135f;
  cdfs->skip_mode_cdf[2] = 0x6041;
  cdfs->skip_mode_cdf[0] = 0x93;
  cdfs->skip_mode_cdf[1] = 0x2f1c;
  *(undefined8 *)(cdfs->tx_size_cdf[2] + 2) = 0x532d696a1bfe2112;
  paaRVar2 = cdfs->tx_size_cdf;
  *(aom_cdf_prob *)((long)(paaRVar2[3] + 1) + 0) = 0x696a;
  *(aom_cdf_prob *)((long)(paaRVar2[3] + 1) + 2) = 0x532d;
  *(aom_cdf_prob *)((long)(paaRVar2[3] + 2) + 0) = 0x3e5d;
  *(aom_cdf_prob *)((long)(paaRVar2[3] + 2) + 2) = 0x2719;
  paaRVar2 = cdfs->tx_size_cdf;
  *(aom_cdf_prob *)((long)(paaRVar2[1] + 1) + 0) = 0x5010;
  *(aom_cdf_prob *)((long)(paaRVar2[1] + 1) + 2) = 0xa24;
  *(aom_cdf_prob *)((long)(paaRVar2[1] + 2) + 0) = 0x370b;
  *(aom_cdf_prob *)((long)(paaRVar2[1] + 2) + 2) = 0x780;
  *(aom_cdf_prob *)((long)(cdfs->tx_size_cdf[2] + 0) + 0) = 0x4d46;
  *(aom_cdf_prob *)((long)(cdfs->tx_size_cdf[2] + 0) + 2) = 0x44b4;
  *(aom_cdf_prob *)((long)(cdfs->tx_size_cdf[2] + 1) + 0) = 0x4d46;
  *(aom_cdf_prob *)((long)(cdfs->tx_size_cdf[2] + 1) + 2) = 0x44b4;
  *(aom_cdf_prob *)((long)(cdfs->tx_size_cdf[0] + 0) + 0) = 0x3200;
  *(aom_cdf_prob *)((long)(cdfs->tx_size_cdf[0] + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(cdfs->tx_size_cdf[0] + 1) + 0) = 0x3200;
  *(aom_cdf_prob *)((long)(cdfs->tx_size_cdf[0] + 1) + 2) = 0;
  *(undefined8 *)(cdfs->tx_size_cdf[0] + 2) = 0xa24501000002100;
  memcpy(cdfs->kf_ymode_cdf,default_kf_y_mode_cdf,600);
  memcpy(cdfs->uv_mode_cdf,default_uv_mode_cdf,0x2a4);
  memcpy(cdfs->if_ymode_cdf,default_if_y_mode_cdf,0x60);
  cdfs->intra_inter_cdf[0] = 0x7cda;
  cdfs->intra_inter_cdf[1] = 0x3eea;
  cdfs->intra_inter_cdf[2] = 0x3126;
  cdfs->intra_inter_cdf[3] = 0x1856;
  *(aom_cdf_prob *)((long)(cdfs->comp_ref_cdf + 0) + 0) = 0x6cae;
  *(aom_cdf_prob *)((long)(cdfs->comp_ref_cdf + 0) + 2) = 0x5b04;
  *(aom_cdf_prob *)((long)(cdfs->comp_ref_cdf + 0) + 4) = 0x7a21;
  *(aom_cdf_prob *)((long)(cdfs->comp_ref_cdf + 1) + 0) = 0x324d;
  *(undefined8 *)(cdfs->comp_ref_cdf[1] + 1) = 0x6ad07f544c82857;
  cdfs->comp_ref_cdf[2][2] = 0x1468;
  *(RK_U16 *)((long)(cdfs->comp_bwdref_cdf + 0) + 0) = 0x7745;
  *(RK_U16 *)((long)(cdfs->comp_bwdref_cdf + 0) + 2) = 0x7a71;
  *(RK_U16 *)((long)(cdfs->comp_bwdref_cdf + 1) + 0) = 0x3ce2;
  *(RK_U16 *)((long)(cdfs->comp_bwdref_cdf + 1) + 2) = 0x44b9;
  cdfs->comp_bwdref_cdf[2] = (RK_U16  [2])0x8e70872;
  cdfs->comp_inter_cdf[0] = 0x1734;
  cdfs->comp_inter_cdf[1] = 0x221d;
  cdfs->comp_inter_cdf[2] = 0x5101;
  cdfs->comp_inter_cdf[3] = 0x5670;
  cdfs->comp_inter_cdf[4] = 0x74ab;
  *(aom_cdf_prob *)((long)(cdfs->single_ref_cdf + 0) + 0) = 0x6cdf;
  *(aom_cdf_prob *)((long)(cdfs->single_ref_cdf + 0) + 2) = 0x79ed;
  *(aom_cdf_prob *)((long)(cdfs->single_ref_cdf + 0) + 4) = 0x6f74;
  *(aom_cdf_prob *)((long)(cdfs->single_ref_cdf + 0) + 6) = 0x5e36;
  *(undefined8 *)(cdfs->single_ref_cdf[0] + 4) = 0x3e913db37a5c7c78;
  paRVar3 = cdfs->single_ref_cdf;
  *(aom_cdf_prob *)((long)(paRVar3 + 1) + 4) = 0x3341;
  *(aom_cdf_prob *)((long)(paRVar3 + 1) + 6) = 0x1f3b;
  *(aom_cdf_prob *)((long)(paRVar3 + 1) + 8) = 0x54fa;
  *(aom_cdf_prob *)((long)(paRVar3 + 1) + 10) = 0x4511;
  *(aom_cdf_prob *)((long)(cdfs->single_ref_cdf + 2) + 0) = 0xbd0;
  *(aom_cdf_prob *)((long)(cdfs->single_ref_cdf + 2) + 2) = 0x9b9;
  *(aom_cdf_prob *)((long)(cdfs->single_ref_cdf + 2) + 4) = 0x626;
  *(aom_cdf_prob *)((long)(cdfs->single_ref_cdf + 2) + 6) = 0x369;
  *(RK_U16 *)((long)(cdfs->single_ref_cdf + 2) + 8) = 0x1705;
  *(RK_U16 *)((long)(cdfs->single_ref_cdf + 2) + 10) = 0x9a0;
  cdfs->comp_ref_type_cdf[0] = 0x7b52;
  cdfs->comp_ref_type_cdf[1] = 0x77ea;
  cdfs->comp_ref_type_cdf[2] = 0x5c32;
  cdfs->comp_ref_type_cdf[3] = 0x62b5;
  cdfs->comp_ref_type_cdf[4][0] = 0x2835;
  cdfs->uni_comp_ref_cdf[0][0] = 0x6b5c;
  cdfs->uni_comp_ref_cdf[0][1] = 0x70e7;
  cdfs->uni_comp_ref_cdf[0][2] = 0x73c8;
  cdfs->uni_comp_ref_cdf[1][0] = 0x2590;
  *(undefined8 *)(cdfs->uni_comp_ref_cdf[1] + 1) = 0x1de003e2445a48a3;
  cdfs->uni_comp_ref_cdf[2][2][0] = 0x17aa;
  cdfs->newmv_cdf[0] = 0x221d;
  cdfs->newmv_cdf[1] = 0x3f0a;
  cdfs->newmv_cdf[2] = 0x4415;
  cdfs->newmv_cdf[3] = 0x5f3e;
  *(undefined8 *)(cdfs->newmv_cdf + 4) = 0x7be277816dbc5042;
  cdfs->refmv_cdf[0] = 0x225a;
  cdfs->refmv_cdf[1] = 0x2184;
  cdfs->refmv_cdf[2] = 0x3a48;
  cdfs->refmv_cdf[3] = 0x1032;
  cdfs->refmv_cdf[4] = 0x2108;
  cdfs->refmv_cdf[5] = 0x322d;
  cdfs->refmv_cdf[6] = 0;
  cdfs->refmv_cdf[7] = 0;
  cdfs->refmv_cdf[8] = 0;
  cdfs->drl_cdf[2] = 0x35ff;
  cdfs->drl_cdf[0] = 0x4cd0;
  cdfs->drl_cdf[1] = 0x2010;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 0xc) + 0) = 0x6d2;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 0xc) + 2) = 0x2f7;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 0xd) + 0) = 0x746d;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 0xd) + 2) = 0x2a3;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 0xe) + 0) = 0x7da7;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 0xe) + 2) = 0x7c51;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 0xf) + 0) = 0x4587;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 0xf) + 2) = 0x2c6a;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 8) + 0) = 0x35a;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 8) + 2) = 0x2c;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 9) + 0) = 0x6fe8;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 9) + 2) = 0x38;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 10) + 0) = 0x7ecf;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 10) + 2) = 0x7739;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 0xb) + 0) = 0x14f5;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 0xb) + 2) = 0x84;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 4) + 0) = 0x61a;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 4) + 2) = 0x32f;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 5) + 0) = 0x6d02;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 5) + 2) = 0x287;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 6) + 0) = 0x7cfe;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 6) + 2) = 0x7b80;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 7) + 0) = 0x2e67;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 7) + 2) = 0x1bdb;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 0) + 0) = 0x341;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 0) + 2) = 0x30;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 1) + 0) = 0x6a40;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 1) + 2) = 0x31;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 2) + 0) = 0x7e5a;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 2) + 2) = 0x7486;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 3) + 0) = 0x11ac;
  *(aom_cdf_prob *)((long)(cdfs->interp_filter_cdf + 3) + 2) = 0xa0;
  (cdfs->mv_cdf).joint_cdf[2] = 0x3480;
  (cdfs->mv_cdf).joint_cdf[0] = 0x7000;
  (cdfs->mv_cdf).joint_cdf[1] = 0x5400;
  (cdfs->mv_cdf).sign_cdf[0] = 0x4000;
  (cdfs->mv_cdf).sign_cdf[1] = 0x4000;
  paRVar5 = (cdfs->mv_cdf).clsss_cdf;
  *(RK_U16 *)((long)(paRVar5 + 1) + 0xc) = 0x1c;
  *(RK_U16 *)((long)(paRVar5 + 1) + 0xe) = 0xb;
  *(RK_U16 *)((long)(paRVar5 + 1) + 0x10) = 6;
  *(RK_U16 *)((long)(paRVar5 + 1) + 0x12) = 1;
  *(undefined8 *)((cdfs->mv_cdf).clsss_cdf[0] + 8) = 0x700100000010006;
  paRVar5 = (cdfs->mv_cdf).clsss_cdf;
  *(RK_U16 *)((long)(paRVar5 + 1) + 4) = 0x38e;
  *(RK_U16 *)((long)(paRVar5 + 1) + 6) = 0x1c0;
  *(RK_U16 *)((long)(paRVar5 + 1) + 8) = 0xd9;
  *(RK_U16 *)((long)(paRVar5 + 1) + 10) = 0x70;
  *(RK_U16 *)((long)((cdfs->mv_cdf).clsss_cdf + 0) + 0) = 0x1000;
  *(RK_U16 *)((long)((cdfs->mv_cdf).clsss_cdf + 0) + 2) = 0x700;
  *(RK_U16 *)((long)((cdfs->mv_cdf).clsss_cdf + 0) + 4) = 0x38e;
  *(RK_U16 *)((long)((cdfs->mv_cdf).clsss_cdf + 0) + 6) = 0x1c0;
  pMVar4 = &cdfs->mv_cdf;
  *(RK_U16 *)((long)(pMVar4->clsss_cdf + 0) + 8) = 0xd9;
  *(RK_U16 *)((long)(pMVar4->clsss_cdf + 0) + 10) = 0x70;
  *(RK_U16 *)((long)(pMVar4->clsss_cdf + 0) + 0xc) = 0x1c;
  *(RK_U16 *)((long)(pMVar4->clsss_cdf + 0) + 0xe) = 0xb;
  *(undefined8 *)((cdfs->mv_cdf).clsss0_fp_cdf[1][0] + 2) = 0x21c02d0050001800;
  *(RK_U16 *)((long)((cdfs->mv_cdf).clsss0_fp_cdf[0] + 0) + 0) = 0x4000;
  *(RK_U16 *)((long)((cdfs->mv_cdf).clsss0_fp_cdf[0] + 0) + 2) = 0x2000;
  *(RK_U16 *)((long)((cdfs->mv_cdf).clsss0_fp_cdf[0] + 0) + 4) = 0x1800;
  *(RK_U16 *)((long)((cdfs->mv_cdf).clsss0_fp_cdf[0] + 1) + 0) = 0x5000;
  *(undefined8 *)((cdfs->mv_cdf).clsss0_fp_cdf[0][1] + 1) = 0x2000400021c02d00;
  paRVar6 = (cdfs->mv_cdf).fp_cdf;
  *(RK_U16 *)((long)(paRVar6 + 1) + 2) = 0x3c00;
  *(RK_U16 *)((long)(paRVar6 + 1) + 4) = 0x2d00;
  *(RK_U16 *)((long)((cdfs->mv_cdf).fp_cdf + 0) + 0) = 0x6000;
  *(RK_U16 *)((long)((cdfs->mv_cdf).fp_cdf + 0) + 2) = 0x3c00;
  *(RK_U16 *)((long)((cdfs->mv_cdf).fp_cdf + 0) + 4) = 0x2d00;
  *(RK_U16 *)((long)((cdfs->mv_cdf).fp_cdf + 1) + 0) = 0x6000;
  (cdfs->mv_cdf).class0_hp_cdf[0] = 0x3000;
  (cdfs->mv_cdf).class0_hp_cdf[1] = 0x3000;
  (cdfs->mv_cdf).hp_cdf[0] = 0x4000;
  (cdfs->mv_cdf).hp_cdf[1] = 0x4000;
  (cdfs->mv_cdf).class0_cdf[0] = 0x1400;
  (cdfs->mv_cdf).class0_cdf[1] = 0x1400;
  paRVar5 = (cdfs->mv_cdf).bits_cdf;
  *(RK_U16 *)((long)(paRVar5 + 1) + 0xc) = 0x1000;
  *(RK_U16 *)((long)(paRVar5 + 1) + 0xe) = 0xb00;
  *(RK_U16 *)((long)(paRVar5 + 1) + 0x10) = 0xb00;
  *(RK_U16 *)((long)(paRVar5 + 1) + 0x12) = 0x800;
  *(undefined8 *)((cdfs->mv_cdf).bits_cdf[0] + 8) = 0x3a003c0008000b00;
  paRVar5 = (cdfs->mv_cdf).bits_cdf;
  *(RK_U16 *)((long)(paRVar5 + 1) + 4) = 0x3600;
  *(RK_U16 *)((long)(paRVar5 + 1) + 6) = 0x3000;
  *(RK_U16 *)((long)(paRVar5 + 1) + 8) = 0x2800;
  *(RK_U16 *)((long)(paRVar5 + 1) + 10) = 0x2000;
  *(RK_U16 *)((long)((cdfs->mv_cdf).bits_cdf + 0) + 0) = 0x3c00;
  *(RK_U16 *)((long)((cdfs->mv_cdf).bits_cdf + 0) + 2) = 0x3a00;
  *(RK_U16 *)((long)((cdfs->mv_cdf).bits_cdf + 0) + 4) = 0x3600;
  *(RK_U16 *)((long)((cdfs->mv_cdf).bits_cdf + 0) + 6) = 0x3000;
  pMVar4 = &cdfs->mv_cdf;
  *(RK_U16 *)((long)(pMVar4->bits_cdf + 0) + 8) = 0x2800;
  *(RK_U16 *)((long)(pMVar4->bits_cdf + 0) + 10) = 0x2000;
  *(RK_U16 *)((long)(pMVar4->bits_cdf + 0) + 0xc) = 0x1000;
  *(RK_U16 *)((long)(pMVar4->bits_cdf + 0) + 0xe) = 0xb00;
  cdfs_ndvc->joint_cdf[0] = 0x7000;
  cdfs_ndvc->joint_cdf[1] = 0x5400;
  cdfs_ndvc->joint_cdf[2] = 0x3480;
  cdfs_ndvc->sign_cdf[0] = 0x4000;
  cdfs_ndvc->sign_cdf[1] = 0x4000;
  paRVar5 = cdfs_ndvc->clsss_cdf;
  *(RK_U16 *)((long)(paRVar5 + 1) + 0xc) = 0x1c;
  *(RK_U16 *)((long)(paRVar5 + 1) + 0xe) = 0xb;
  *(RK_U16 *)((long)(paRVar5 + 1) + 0x10) = 6;
  *(RK_U16 *)((long)(paRVar5 + 1) + 0x12) = 1;
  *(RK_U16 *)((long)(cdfs_ndvc->clsss_cdf + 0) + 0) = 0x1000;
  *(RK_U16 *)((long)(cdfs_ndvc->clsss_cdf + 0) + 2) = 0x700;
  *(RK_U16 *)((long)(cdfs_ndvc->clsss_cdf + 0) + 4) = 0x38e;
  *(RK_U16 *)((long)(cdfs_ndvc->clsss_cdf + 0) + 6) = 0x1c0;
  *(RK_U16 *)((long)(cdfs_ndvc->clsss_cdf + 0) + 8) = 0xd9;
  *(RK_U16 *)((long)(cdfs_ndvc->clsss_cdf + 0) + 10) = 0x70;
  *(RK_U16 *)((long)(cdfs_ndvc->clsss_cdf + 0) + 0xc) = 0x1c;
  *(RK_U16 *)((long)(cdfs_ndvc->clsss_cdf + 0) + 0xe) = 0xb;
  *(undefined8 *)(cdfs_ndvc->clsss_cdf[0] + 8) = 0x700100000010006;
  paRVar5 = cdfs_ndvc->clsss_cdf;
  *(RK_U16 *)((long)(paRVar5 + 1) + 4) = 0x38e;
  *(RK_U16 *)((long)(paRVar5 + 1) + 6) = 0x1c0;
  *(RK_U16 *)((long)(paRVar5 + 1) + 8) = 0xd9;
  *(RK_U16 *)((long)(paRVar5 + 1) + 10) = 0x70;
  *(undefined8 *)(cdfs_ndvc->clsss0_fp_cdf[1][0] + 2) = 0x21c02d0050001800;
  *(RK_U16 *)((long)(cdfs_ndvc->clsss0_fp_cdf[0] + 0) + 0) = 0x4000;
  *(RK_U16 *)((long)(cdfs_ndvc->clsss0_fp_cdf[0] + 0) + 2) = 0x2000;
  *(RK_U16 *)((long)(cdfs_ndvc->clsss0_fp_cdf[0] + 0) + 4) = 0x1800;
  *(RK_U16 *)((long)(cdfs_ndvc->clsss0_fp_cdf[0] + 1) + 0) = 0x5000;
  *(undefined8 *)(cdfs_ndvc->clsss0_fp_cdf[0][1] + 1) = 0x2000400021c02d00;
  *(RK_U16 *)((long)(cdfs_ndvc->fp_cdf + 0) + 0) = 0x6000;
  *(RK_U16 *)((long)(cdfs_ndvc->fp_cdf + 0) + 2) = 0x3c00;
  *(RK_U16 *)((long)(cdfs_ndvc->fp_cdf + 0) + 4) = 0x2d00;
  *(RK_U16 *)((long)(cdfs_ndvc->fp_cdf + 1) + 0) = 0x6000;
  *(RK_U16 *)((long)(cdfs_ndvc->fp_cdf + 1) + 2) = 0x3c00;
  *(RK_U16 *)((long)(cdfs_ndvc->fp_cdf + 1) + 4) = 0x2d00;
  cdfs_ndvc->class0_hp_cdf[0] = 0x3000;
  cdfs_ndvc->class0_hp_cdf[1] = 0x3000;
  cdfs_ndvc->hp_cdf[0] = 0x4000;
  cdfs_ndvc->hp_cdf[1] = 0x4000;
  cdfs_ndvc->class0_cdf[0] = 0x1400;
  cdfs_ndvc->class0_cdf[1] = 0x1400;
  paRVar5 = cdfs_ndvc->bits_cdf;
  *(RK_U16 *)((long)(paRVar5 + 1) + 0xc) = 0x1000;
  *(RK_U16 *)((long)(paRVar5 + 1) + 0xe) = 0xb00;
  *(RK_U16 *)((long)(paRVar5 + 1) + 0x10) = 0xb00;
  *(RK_U16 *)((long)(paRVar5 + 1) + 0x12) = 0x800;
  *(undefined8 *)(cdfs_ndvc->bits_cdf[0] + 8) = 0x3a003c0008000b00;
  paRVar5 = cdfs_ndvc->bits_cdf;
  *(RK_U16 *)((long)(paRVar5 + 1) + 4) = 0x3600;
  *(RK_U16 *)((long)(paRVar5 + 1) + 6) = 0x3000;
  *(RK_U16 *)((long)(paRVar5 + 1) + 8) = 0x2800;
  *(RK_U16 *)((long)(paRVar5 + 1) + 10) = 0x2000;
  *(RK_U16 *)((long)(cdfs_ndvc->bits_cdf + 0) + 0) = 0x3c00;
  *(RK_U16 *)((long)(cdfs_ndvc->bits_cdf + 0) + 2) = 0x3a00;
  *(RK_U16 *)((long)(cdfs_ndvc->bits_cdf + 0) + 4) = 0x3600;
  *(RK_U16 *)((long)(cdfs_ndvc->bits_cdf + 0) + 6) = 0x3000;
  *(RK_U16 *)((long)(cdfs_ndvc->bits_cdf + 0) + 8) = 0x2800;
  *(RK_U16 *)((long)(cdfs_ndvc->bits_cdf + 0) + 10) = 0x2000;
  *(RK_U16 *)((long)(cdfs_ndvc->bits_cdf + 0) + 0xc) = 0x1000;
  *(RK_U16 *)((long)(cdfs_ndvc->bits_cdf + 0) + 0xe) = 0xb00;
  cdfs->obmc_cdf[0] = 0x4000;
  cdfs->obmc_cdf[1] = 0x4000;
  cdfs->obmc_cdf[2] = 0x4000;
  cdfs->obmc_cdf[3] = 0x573b;
  cdfs->obmc_cdf[4] = 0x5b65;
  cdfs->obmc_cdf[5] = 0x5bab;
  cdfs->obmc_cdf[6] = 0x3be8;
  cdfs->obmc_cdf[7] = 0x47a9;
  cdfs->obmc_cdf[8] = 0x44da;
  cdfs->obmc_cdf[9] = 0x1b27;
  cdfs->obmc_cdf[10] = 0x26d9;
  cdfs->obmc_cdf[0xb] = 0x29bd;
  cdfs->obmc_cdf[0xc] = 0xa50;
  cdfs->obmc_cdf[0xd] = 0x6da;
  cdfs->obmc_cdf[0xe] = 0x4b8;
  cdfs->obmc_cdf[0xf] = 0x82;
  cdfs->obmc_cdf[0xe] = 0x4b8;
  cdfs->obmc_cdf[0xf] = 0x82;
  cdfs->obmc_cdf[0x10] = 0x4000;
  cdfs->obmc_cdf[0x11] = 0x4000;
  cdfs->obmc_cdf[0x12] = 0x2390;
  cdfs->obmc_cdf[0x13] = 0x2e5b;
  cdfs->obmc_cdf[0x14] = 0x2238;
  cdfs->obmc_cdf[0x15] = 0x1701;
  memcpy(cdfs->motion_mode_cdf,default_motion_mode_cdf,0x58);
  memcpy(cdfs->inter_compound_mode_cdf,default_inter_compound_mode_cdf,0xd2);
  cdfs->compound_type_cdf[0] = 0x4000;
  cdfs->compound_type_cdf[1] = 0x4000;
  cdfs->compound_type_cdf[2] = 0x4000;
  cdfs->compound_type_cdf[3] = 0x2479;
  cdfs->compound_type_cdf[4] = 0x4c8d;
  cdfs->compound_type_cdf[5] = 0x5332;
  cdfs->compound_type_cdf[6] = 0x59d6;
  cdfs->compound_type_cdf[7] = 0x5c74;
  cdfs->compound_type_cdf[8] = 0x5fd7;
  cdfs->compound_type_cdf[9] = 0x67e4;
  cdfs->compound_type_cdf[10] = 0x4000;
  cdfs->compound_type_cdf[0xb] = 0x4000;
  cdfs->compound_type_cdf[0xc] = 0x4000;
  cdfs->compound_type_cdf[0xd] = 0x4000;
  cdfs->compound_type_cdf[0xe] = 0x4000;
  cdfs->compound_type_cdf[0xf] = 0x4000;
  cdfs->compound_type_cdf[0xe] = 0x4000;
  cdfs->compound_type_cdf[0xf] = 0x4000;
  cdfs->compound_type_cdf[0x10] = 0x4000;
  cdfs->compound_type_cdf[0x11] = 0x4000;
  cdfs->compound_type_cdf[0x12] = 0x51d4;
  cdfs->compound_type_cdf[0x13] = 0x61eb;
  cdfs->compound_type_cdf[0x14] = 0x4000;
  cdfs->compound_type_cdf[0x15] = 0x4000;
  cdfs->interintra_cdf[0] = 0x4000;
  cdfs->interintra_cdf[1] = 0x16f9;
  cdfs->interintra_cdf[2] = 0x1433;
  cdfs->interintra_cdf[3] = 0x9e3;
  *(undefined8 *)(cdfs->interintra_mode_cdf[2] + 2) = 0x1aba52ef6f7218ec;
  *(aom_cdf_prob *)((long)(cdfs->interintra_mode_cdf + 0) + 0) = 0x6000;
  *(aom_cdf_prob *)((long)(cdfs->interintra_mode_cdf + 0) + 2) = 0x4000;
  *(aom_cdf_prob *)((long)(cdfs->interintra_mode_cdf + 0) + 4) = 0x2000;
  *(aom_cdf_prob *)((long)(cdfs->interintra_mode_cdf + 1) + 0) = 0x78ad;
  *(undefined8 *)(cdfs->interintra_mode_cdf[1] + 1) = 0x58f47657153c54b6;
  cdfs->wedge_interintra_cdf[0] = 0x4000;
  cdfs->wedge_interintra_cdf[1] = 0x4000;
  cdfs->wedge_interintra_cdf[2] = 0x4000;
  cdfs->wedge_interintra_cdf[3] = 0x31bc;
  cdfs->wedge_interintra_cdf[4] = 0x1e83;
  cdfs->wedge_interintra_cdf[5] = 0x17b0;
  cdfs->wedge_interintra_cdf[6] = 0x1476;
  cdfs->wedge_interintra_cdf[7] = 0xc84;
  cdfs->wedge_interintra_cdf[8] = 0xcfc;
  cdfs->wedge_interintra_cdf[9] = 0x1708;
  cdfs->wedge_interintra_cdf[10] = 0x4000;
  cdfs->wedge_interintra_cdf[0xb] = 0x4000;
  cdfs->wedge_interintra_cdf[0xc] = 0x4000;
  cdfs->wedge_interintra_cdf[0xd] = 0x4000;
  cdfs->wedge_interintra_cdf[0xe] = 0x4000;
  cdfs->wedge_interintra_cdf[0xf] = 0x4000;
  cdfs->wedge_interintra_cdf[0xe] = 0x4000;
  cdfs->wedge_interintra_cdf[0xf] = 0x4000;
  cdfs->wedge_interintra_cdf[0x10] = 0x4000;
  cdfs->wedge_interintra_cdf[0x11] = 0x4000;
  cdfs->wedge_interintra_cdf[0x12] = 0x4000;
  cdfs->wedge_interintra_cdf[0x13] = 0x4000;
  cdfs->wedge_interintra_cdf[0x14] = 0x4000;
  cdfs->wedge_interintra_cdf[0x15] = 0x4000;
  memcpy(cdfs->wedge_idx_cdf,default_wedge_idx_cdf,0x294);
  cdfs->palette_y_mode_cdf[0][0] = 0x444;
  cdfs->palette_y_mode_cdf[0][1] = 0x72a5;
  cdfs->palette_y_mode_cdf[0][2] = 0x7b13;
  cdfs->palette_y_mode_cdf[1][0] = 0x358;
  *(undefined8 *)(cdfs->palette_y_mode_cdf[1] + 1) = 0x72b803b17c2c74d5;
  *(undefined8 *)(cdfs->palette_y_mode_cdf[2] + 2) = 0x7c78721702e27cf3;
  cdfs->palette_y_mode_cdf[4][0] = 0x1cb;
  cdfs->palette_y_mode_cdf[4][1] = 0x6357;
  cdfs->palette_y_mode_cdf[4][2] = 0x7a4a;
  cdfs->palette_y_mode_cdf[5][0] = 0x1f7;
  *(undefined8 *)(cdfs->palette_y_mode_cdf[4] + 1) = 0x705101f77a4a6357;
  *(undefined8 *)(cdfs->palette_y_mode_cdf[5] + 2) = 0x7f7f60f6013e7a0f;
  cdfs->palette_uv_mode_cdf[0] = 0x133;
  cdfs->palette_uv_mode_cdf[1] = 0x2c10;
  memcpy(cdfs->palette_y_size_cdf,default_palette_y_size_cdf,0x54);
  memcpy(cdfs->palette_uv_size_cdf,default_palette_uv_size_cdf,0x54);
  memcpy(cdfs->palette_y_color_index_cdf,default_palette_y_color_index_cdf,0x120);
  memcpy(cdfs->palette_uv_color_index_cdf,default_palette_uv_color_index_cdf,0x120);
  cdfs->cfl_sign_cdf[0] = 0x7a76;
  cdfs->cfl_sign_cdf[1] = 0x77b5;
  cdfs->cfl_sign_cdf[2] = 0x4be4;
  cdfs->cfl_sign_cdf[3] = 0x381b;
  cdfs->cfl_sign_cdf[3] = 0x381b;
  cdfs->cfl_sign_cdf[4] = 0x16a4;
  cdfs->cfl_sign_cdf[5] = 0x1149;
  cdfs->cfl_sign_cdf[6] = 0x1da;
  memcpy(cdfs->cfl_alpha_cdf,default_cfl_alpha_cdf,0xb4);
  cdfs->intrabc_cdf[0] = 0x8bd;
  memcpy(cdfs->angle_delta_cdf,default_angle_delta_cdf,0x60);
  cdfs->filter_intra_mode_cdf[0] = 0x5d0b;
  cdfs->filter_intra_mode_cdf[1] = 0x4e18;
  cdfs->filter_intra_mode_cdf[2] = 0x3cc5;
  cdfs->filter_intra_mode_cdf[3] = 0xc8a;
  cdfs->filter_intra_cdf[0] = 0x6df3;
  cdfs->filter_intra_cdf[1] = 0x65a9;
  cdfs->filter_intra_cdf[2] = 0x68fb;
  cdfs->filter_intra_cdf[3] = 0x6146;
  cdfs->filter_intra_cdf[4] = 0x4ef9;
  cdfs->filter_intra_cdf[5] = 0x5b4e;
  cdfs->filter_intra_cdf[6] = 0x4f88;
  cdfs->filter_intra_cdf[7] = 0x4823;
  cdfs->filter_intra_cdf[8] = 0x4e2c;
  cdfs->filter_intra_cdf[9] = 0x28b9;
  cdfs->filter_intra_cdf[10] = 0x4000;
  cdfs->filter_intra_cdf[0xb] = 0x4000;
  cdfs->filter_intra_cdf[0xc] = 0x4000;
  cdfs->filter_intra_cdf[0xd] = 0x4000;
  cdfs->filter_intra_cdf[0xe] = 0x4000;
  cdfs->filter_intra_cdf[0xf] = 0x4000;
  cdfs->filter_intra_cdf[0xe] = 0x4000;
  cdfs->filter_intra_cdf[0xf] = 0x4000;
  cdfs->filter_intra_cdf[0x10] = 0x4e1e;
  cdfs->filter_intra_cdf[0x11] = 0x5780;
  cdfs->filter_intra_cdf[0x12] = 0x30fb;
  cdfs->filter_intra_cdf[0x13] = 0x394b;
  cdfs->filter_intra_cdf[0x14] = 0x4000;
  cdfs->filter_intra_cdf[0x15] = 0x4000;
  cdfs->comp_group_idx_cdf[0] = 0x1811;
  cdfs->comp_group_idx_cdf[1] = 0x2695;
  cdfs->comp_group_idx_cdf[2] = 0x3668;
  cdfs->comp_group_idx_cdf[3] = 0x1fee;
  cdfs->comp_group_idx_cdf[3] = 0x1fee;
  cdfs->comp_group_idx_cdf[4] = 0x3222;
  cdfs->comp_group_idx_cdf[5] = 0x276e;
  cdfs->comp_group_idx_cdf[6] = 0;
  cdfs->compound_idx_cdf[0] = 0x38bc;
  cdfs->compound_idx_cdf[1] = 0x4dbf;
  cdfs->compound_idx_cdf[2] = 0x6473;
  cdfs->compound_idx_cdf[3] = 0x4c35;
  cdfs->compound_idx_cdf[4] = 0x5b8a;
  cdfs->compound_idx_cdf[5] = 0x6ddc;
  return;
}

Assistant:

void AV1SetDefaultCDFs(AV1CDFs *cdfs, MvCDFs *cdfs_ndvc)
{
    // AV1CDFs *cdfs = (AV1CDFs*)ptr;
    // MvCDFs *cdfs_ndvc = &cdfs->mv_cdf;

    memcpy(cdfs->partition_cdf, default_partition_cdf,
           sizeof(cdfs->partition_cdf));

    memcpy(cdfs->tx_type_intra0_cdf, default_intra_ext_tx0_cdf,
           sizeof(cdfs->tx_type_intra0_cdf));
    memcpy(cdfs->tx_type_intra1_cdf, default_intra_ext_tx1_cdf,
           sizeof(cdfs->tx_type_intra1_cdf));
    memcpy(cdfs->tx_type_inter_cdf, default_inter_ext_tx_cdf,
           sizeof(cdfs->tx_type_inter_cdf));

    memcpy(cdfs->vartx_part_cdf, default_txfm_partition_cdf,
           sizeof(cdfs->vartx_part_cdf));
    memcpy(cdfs->mbskip_cdf, default_skip_cdfs, sizeof(cdfs->mbskip_cdf));
    memcpy(cdfs->delta_q_cdf, default_delta_q_cdf,
           sizeof(cdfs->delta_q_cdf));
    memcpy(cdfs->delta_lf_multi_cdf, default_delta_lf_multi_cdf,
           sizeof(cdfs->delta_lf_multi_cdf));
    memcpy(cdfs->delta_lf_cdf, default_delta_lf_cdf,
           sizeof(cdfs->delta_lf_cdf));

    memcpy(cdfs->segment_pred_cdf, default_segment_pred_cdf,
           sizeof(cdfs->segment_pred_cdf));

    memcpy(cdfs->spatial_pred_seg_tree_cdf, default_spatial_pred_seg_tree_cdf,
           sizeof(cdfs->spatial_pred_seg_tree_cdf));

    memcpy(cdfs->skip_mode_cdf, default_skip_mode_cdfs,
           sizeof(cdfs->skip_mode_cdf));

    memcpy(cdfs->tx_size_cdf, default_tx_size_cdf,
           sizeof(cdfs->tx_size_cdf));

    memcpy(cdfs->kf_ymode_cdf, default_kf_y_mode_cdf,
           sizeof(cdfs->kf_ymode_cdf));
    memcpy(cdfs->uv_mode_cdf, default_uv_mode_cdf,
           sizeof(cdfs->uv_mode_cdf));
    memcpy(cdfs->if_ymode_cdf, default_if_y_mode_cdf,
           sizeof(cdfs->if_ymode_cdf));

    memcpy(cdfs->intra_inter_cdf, default_intra_inter_cdf,
           sizeof(cdfs->intra_inter_cdf));

    memcpy(cdfs->comp_ref_cdf, default_comp_ref_cdf,
           sizeof(cdfs->comp_ref_cdf));
    memcpy(cdfs->comp_bwdref_cdf, default_comp_bwdref_cdf,
           sizeof(cdfs->comp_bwdref_cdf));

    memcpy(cdfs->comp_inter_cdf, default_comp_inter_cdf,
           sizeof(cdfs->comp_inter_cdf));

    memcpy(cdfs->single_ref_cdf, default_single_ref_cdf,
           sizeof(cdfs->single_ref_cdf));
    memcpy(cdfs->comp_ref_type_cdf, default_comp_ref_type_cdf,
           sizeof(cdfs->comp_ref_type_cdf));
    memcpy(cdfs->uni_comp_ref_cdf, default_uni_comp_ref_cdf,
           sizeof(cdfs->uni_comp_ref_cdf));

    memcpy(cdfs->newmv_cdf, default_newmv_cdf, sizeof(cdfs->newmv_cdf));
    memcpy(cdfs->zeromv_cdf, default_zeromv_cdf, sizeof(cdfs->zeromv_cdf));
    memcpy(cdfs->refmv_cdf, default_refmv_cdf, sizeof(cdfs->refmv_cdf));
    memcpy(cdfs->drl_cdf, default_drl_cdf, sizeof(cdfs->drl_cdf));

    memcpy(cdfs->interp_filter_cdf, default_switchable_interp_cdf,
           sizeof(cdfs->interp_filter_cdf));

    // Regular MV cdfs
    memcpy(cdfs->mv_cdf.joint_cdf, default_joint_cdf,
           sizeof(cdfs->mv_cdf.joint_cdf));
    memcpy(cdfs->mv_cdf.sign_cdf, default_sign_cdf,
           sizeof(cdfs->mv_cdf.sign_cdf));
    memcpy(cdfs->mv_cdf.clsss_cdf, default_clsss_cdf,
           sizeof(cdfs->mv_cdf.clsss_cdf));
    memcpy(cdfs->mv_cdf.clsss0_fp_cdf, default_clsss0_fp_cdf,
           sizeof(cdfs->mv_cdf.clsss0_fp_cdf));
    memcpy(cdfs->mv_cdf.fp_cdf, default_fp_cdf,
           sizeof(cdfs->mv_cdf.fp_cdf));
    memcpy(cdfs->mv_cdf.class0_hp_cdf, default_class0_hp_cdf,
           sizeof(cdfs->mv_cdf.class0_hp_cdf));
    memcpy(cdfs->mv_cdf.hp_cdf, default_hp_cdf,
           sizeof(cdfs->mv_cdf.hp_cdf));
    memcpy(cdfs->mv_cdf.class0_cdf, default_class0_cdf,
           sizeof(cdfs->mv_cdf.class0_cdf));
    memcpy(cdfs->mv_cdf.bits_cdf, default_bits_cdf,
           sizeof(cdfs->mv_cdf.bits_cdf));

    // Intrabc cdfs
    memcpy(cdfs_ndvc->joint_cdf, default_joint_cdf,
           sizeof(cdfs_ndvc->joint_cdf));
    memcpy(cdfs_ndvc->sign_cdf, default_sign_cdf,
           sizeof(cdfs_ndvc->sign_cdf));
    memcpy(cdfs_ndvc->clsss_cdf, default_clsss_cdf,
           sizeof(cdfs_ndvc->clsss_cdf));
    memcpy(cdfs_ndvc->clsss0_fp_cdf, default_clsss0_fp_cdf,
           sizeof(cdfs_ndvc->clsss0_fp_cdf));
    memcpy(cdfs_ndvc->fp_cdf, default_fp_cdf, sizeof(cdfs_ndvc->fp_cdf));
    memcpy(cdfs_ndvc->class0_hp_cdf, default_class0_hp_cdf,
           sizeof(cdfs_ndvc->class0_hp_cdf));
    memcpy(cdfs_ndvc->hp_cdf, default_hp_cdf, sizeof(cdfs_ndvc->hp_cdf));
    memcpy(cdfs_ndvc->class0_cdf, default_class0_cdf,
           sizeof(cdfs_ndvc->class0_cdf));
    memcpy(cdfs_ndvc->bits_cdf, default_bits_cdf,
           sizeof(cdfs_ndvc->bits_cdf));

    memcpy(cdfs->obmc_cdf, default_obmc_cdf, sizeof(cdfs->obmc_cdf));
    memcpy(cdfs->motion_mode_cdf, default_motion_mode_cdf,
           sizeof(cdfs->motion_mode_cdf));

    memcpy(cdfs->inter_compound_mode_cdf, default_inter_compound_mode_cdf,
           sizeof(cdfs->inter_compound_mode_cdf));
    memcpy(cdfs->compound_type_cdf, default_compound_type_cdf,
           sizeof(cdfs->compound_type_cdf));
    memcpy(cdfs->interintra_cdf, default_interintra_cdf,
           sizeof(cdfs->interintra_cdf));
    memcpy(cdfs->interintra_mode_cdf, default_interintra_mode_cdf,
           sizeof(cdfs->interintra_mode_cdf));
    memcpy(cdfs->wedge_interintra_cdf, default_wedge_interintra_cdf,
           sizeof(cdfs->wedge_interintra_cdf));
    memcpy(cdfs->wedge_idx_cdf, default_wedge_idx_cdf,
           sizeof(cdfs->wedge_idx_cdf));

    memcpy(cdfs->palette_y_mode_cdf, default_palette_y_mode_cdf,
           sizeof(cdfs->palette_y_mode_cdf));
    memcpy(cdfs->palette_uv_mode_cdf, default_palette_uv_mode_cdf,
           sizeof(cdfs->palette_uv_mode_cdf));
    memcpy(cdfs->palette_y_size_cdf, default_palette_y_size_cdf,
           sizeof(cdfs->palette_y_size_cdf));
    memcpy(cdfs->palette_uv_size_cdf, default_palette_uv_size_cdf,
           sizeof(cdfs->palette_uv_size_cdf));
    memcpy(cdfs->palette_y_color_index_cdf, default_palette_y_color_index_cdf,
           sizeof(cdfs->palette_y_color_index_cdf));
    memcpy(cdfs->palette_uv_color_index_cdf,
           default_palette_uv_color_index_cdf,
           sizeof(cdfs->palette_uv_color_index_cdf));

    memcpy(cdfs->cfl_sign_cdf, default_cfl_sign_cdf,
           sizeof(cdfs->cfl_sign_cdf));
    memcpy(cdfs->cfl_alpha_cdf, default_cfl_alpha_cdf,
           sizeof(cdfs->cfl_alpha_cdf));

    memcpy(cdfs->intrabc_cdf, default_intrabc_cdf,
           sizeof(cdfs->intrabc_cdf));
    memcpy(cdfs->angle_delta_cdf, default_angle_delta_cdf,
           sizeof(cdfs->angle_delta_cdf));
    memcpy(cdfs->filter_intra_mode_cdf, default_filter_intra_mode_cdf,
           sizeof(cdfs->filter_intra_mode_cdf));
    memcpy(cdfs->filter_intra_cdf, default_filter_intra_cdfs,
           sizeof(cdfs->filter_intra_cdf));
    memcpy(cdfs->comp_group_idx_cdf, default_comp_group_idx_cdfs,
           sizeof(cdfs->comp_group_idx_cdf));
    memcpy(cdfs->compound_idx_cdf, default_compound_idx_cdfs,
           sizeof(cdfs->compound_idx_cdf));

    // Av1DefaultCoeffProbs(x);
}